

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4_binary.cc
# Opt level: O3

bool lf::io::detail::ParseGmshFileV4Binary
               (const_iterator begin,const_iterator end,int one,GMshFileV4 *result)

{
  result_type rVar1;
  undefined4 in_register_00000014;
  bool bVar2;
  skipper_type skipper_;
  type attr_;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  grammar;
  char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>
  local_781;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_780;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_778;
  MshFileV4Adapted local_770;
  context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>
  local_768;
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_750;
  
  local_780._M_current = begin._M_current;
  local_778._M_current = end._M_current;
  if (one == 1) {
    (anonymous_namespace)::
    MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
    MshV4GrammarBinary<boost::spirit::terminal<boost::spirit::tag::little_dword>,boost::spirit::terminal<boost::spirit::tag::little_qword>,boost::spirit::terminal<boost::spirit::tag::little_bin_double>>
              ((MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *
               )&local_750,(terminal<boost::spirit::tag::little_dword> *)end._M_current,
               (terminal<boost::spirit::tag::little_qword> *)CONCAT44(in_register_00000014,one),
               (terminal<boost::spirit::tag::little_bin_double> *)result);
    if (*(long *)((long)local_750.
                        super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
                        .
                        super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                        .proto_expr_.child0.ref.t_ + 0x28) != 0) {
      local_768.attributes.car = &local_770;
      local_770.obj = result;
      rVar1 = boost::
              function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
              ::operator()((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                            *)((long)local_750.
                                     super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
                                     .
                                     super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                                     .proto_expr_.child0.ref.t_ + 0x28),&local_780,&local_778,
                           &local_768,&local_781);
      if (rVar1) {
        bVar2 = true;
        while (((local_780._M_current != local_778._M_current && (-1 < (long)*local_780._M_current))
               && ((boost::spirit::char_encoding::ascii_char_types[*local_780._M_current] & 0x40) !=
                   0))) {
          local_780._M_current = local_780._M_current + 1;
        }
        goto LAB_001ca52e;
      }
    }
  }
  else {
    (anonymous_namespace)::
    MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
    MshV4GrammarBinary<boost::spirit::terminal<boost::spirit::tag::big_dword>,boost::spirit::terminal<boost::spirit::tag::big_qword>,boost::spirit::terminal<boost::spirit::tag::big_bin_double>>
              ((MshV4GrammarBinary<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *
               )&local_750,(terminal<boost::spirit::tag::big_dword> *)end._M_current,
               (terminal<boost::spirit::tag::big_qword> *)CONCAT44(in_register_00000014,one),
               (terminal<boost::spirit::tag::big_bin_double> *)result);
    if (*(long *)((long)local_750.
                        super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
                        .
                        super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                        .proto_expr_.child0.ref.t_ + 0x28) != 0) {
      local_768.attributes.car = &local_770;
      local_770.obj = result;
      rVar1 = boost::
              function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
              ::operator()((function_n<bool,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_const___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_&,_boost::spirit::context<boost::fusion::cons<boost::fusion::adapted::MshFileV4Adapted_&,_boost::fusion::nil_>,_boost::fusion::vector<>_>_&,_const_boost::spirit::qi::char_class<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>_&>
                            *)((long)local_750.
                                     super_grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>
                                     .
                                     super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::fusion::adapted::MshFileV4Adapted_(),_boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::space,_boost::spirit::char_encoding::ascii>_>,_0L>,_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
                                     .proto_expr_.child0.ref.t_ + 0x28),&local_780,&local_778,
                           &local_768,&local_781);
      if (rVar1) {
        bVar2 = true;
        while (((local_780._M_current != local_778._M_current && (-1 < (long)*local_780._M_current))
               && ((boost::spirit::char_encoding::ascii_char_types[*local_780._M_current] & 0x40) !=
                   0))) {
          local_780._M_current = local_780._M_current + 1;
        }
        goto LAB_001ca52e;
      }
    }
  }
  bVar2 = false;
LAB_001ca52e:
  anon_unknown_0::
  MshV4GrammarBinary<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~MshV4GrammarBinary(&local_750);
  return bVar2;
}

Assistant:

bool ParseGmshFileV4Binary(std::string::const_iterator begin,
                           std::string::const_iterator end, int one,
                           GMshFileV4* result) {
  if (one == 1) {
    const MshV4GrammarBinary<std::string::const_iterator> grammar(
        qi::little_dword, qi::little_qword, qi::little_bin_double);
    return qi::phrase_parse(begin, end, grammar, ascii::space, *result);
  }
  const MshV4GrammarBinary<std::string::const_iterator> grammar(
      qi::big_dword, qi::big_qword, qi::big_bin_double);
  return qi::phrase_parse(begin, end, grammar, ascii::space, *result);
}